

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O0

optional<metaf::WindGroup> *
metaf::WindGroup::parse(string *group,ReportPart reportPart,ReportMetadata *reportMetadata)

{
  bool bVar1;
  int iVar2;
  difference_type dVar3;
  int in_EDX;
  optional<metaf::WindGroup> *in_RDI;
  optional<metaf::Direction> oVar4;
  _Optional_payload_base<metaf::Speed> _Var5;
  optional<metaf::Distance> wsHeight;
  optional<metaf::Speed> gust;
  optional<metaf::Direction> dir;
  WindGroup result_1;
  optional<metaf::Speed> speed;
  optional<metaf::Speed::Unit> speedUnit;
  smatch match;
  optional<metaf::WindGroup> result;
  IncompleteText in_stack_fffffffffffffb08;
  Type in_stack_fffffffffffffb0c;
  WindGroup *in_stack_fffffffffffffb10;
  string *in_stack_fffffffffffffb18;
  undefined7 in_stack_fffffffffffffb20;
  undefined1 in_stack_fffffffffffffb27;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *in_stack_fffffffffffffb28;
  undefined7 in_stack_fffffffffffffb30;
  undefined1 in_stack_fffffffffffffb37;
  byte bVar6;
  difference_type in_stack_fffffffffffffb38;
  Unit unit;
  undefined4 in_stack_fffffffffffffb40;
  flag_type in_stack_fffffffffffffb44;
  char *in_stack_fffffffffffffb48;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *in_stack_fffffffffffffb50;
  string local_478 [56];
  string local_440 [32];
  _Optional_payload_base<metaf::Speed> local_420;
  _Storage<metaf::Direction,_true> local_410;
  undefined4 local_408;
  string local_400 [32];
  _Storage<metaf::Direction,_true> local_3e0;
  undefined4 local_3d8;
  byte local_3d1;
  string local_3d0 [39];
  byte local_3a9;
  string local_3a8 [8];
  string *in_stack_fffffffffffffc60;
  string local_320 [36];
  _Optional_payload_base<metaf::Speed> local_2fc;
  int local_2ec;
  string local_2e8 [32];
  _Optional_payload_base<metaf::Speed::Unit> local_2c8;
  int local_c;
  
  local_c = in_EDX;
  if ((in_EDX == 2) &&
     (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffb10,
                              (char *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08))
     , bVar1)) {
    WindGroup(in_stack_fffffffffffffb10,in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08);
    std::optional<metaf::WindGroup>::optional<metaf::WindGroup,_true>
              ((optional<metaf::WindGroup> *)in_stack_fffffffffffffb10,
               (WindGroup *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
  }
  else if ((local_c == 3) &&
          (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)in_stack_fffffffffffffb10,
                                   (char *)CONCAT44(in_stack_fffffffffffffb0c,
                                                    in_stack_fffffffffffffb08)), bVar1)) {
    WindGroup(in_stack_fffffffffffffb10,in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08);
    std::optional<metaf::WindGroup>::optional<metaf::WindGroup,_true>
              ((optional<metaf::WindGroup> *)in_stack_fffffffffffffb10,
               (WindGroup *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
  }
  else {
    if (local_c == 4) {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffb10,
                              (char *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08))
      ;
      if (bVar1) {
        WindGroup(in_stack_fffffffffffffb10,in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08);
        std::optional<metaf::WindGroup>::optional<metaf::WindGroup,_true>
                  ((optional<metaf::WindGroup> *)in_stack_fffffffffffffb10,
                   (WindGroup *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
        return in_RDI;
      }
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffb10,
                              (char *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08))
      ;
      if (bVar1) {
        WindGroup(in_stack_fffffffffffffb10,in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08);
        std::optional<metaf::WindGroup>::optional<metaf::WindGroup,_true>
                  ((optional<metaf::WindGroup> *)in_stack_fffffffffffffb10,
                   (WindGroup *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
        return in_RDI;
      }
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffb10,
                              (char *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08))
      ;
      if (bVar1) {
        WindGroup(in_stack_fffffffffffffb10,in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08);
        std::optional<metaf::WindGroup>::optional<metaf::WindGroup,_true>
                  ((optional<metaf::WindGroup> *)in_stack_fffffffffffffb10,
                   (WindGroup *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
        return in_RDI;
      }
    }
    if ((local_c == 2) || (local_c == 3)) {
      parseVariableSector(in_stack_fffffffffffffc60);
      bVar1 = std::optional<metaf::WindGroup>::has_value((optional<metaf::WindGroup> *)0x254143);
      if (bVar1) {
        std::optional<metaf::WindGroup>::operator*((optional<metaf::WindGroup> *)0x254156);
        std::optional<metaf::WindGroup>::optional<const_metaf::WindGroup_&,_true>
                  ((optional<metaf::WindGroup> *)in_stack_fffffffffffffb10,
                   (WindGroup *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
      }
      else {
        if ((parse(std::__cxx11::string_const&,metaf::ReportPart,metaf::ReportMetadata_const&)::
             windRgx_abi_cxx11_ == '\0') &&
           (iVar2 = __cxa_guard_acquire(&parse(std::__cxx11::string_const&,metaf::ReportPart,metaf::ReportMetadata_const&)
                                         ::windRgx_abi_cxx11_), iVar2 != 0)) {
          std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                    (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,in_stack_fffffffffffffb44);
          __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                       ~basic_regex,
                       &parse(std::__cxx11::string_const&,metaf::ReportPart,metaf::ReportMetadata_const&)
                        ::windRgx_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&parse(std::__cxx11::string_const&,metaf::ReportPart,metaf::ReportMetadata_const&)
                               ::windRgx_abi_cxx11_);
        }
        std::__cxx11::
        match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)in_stack_fffffffffffffb10);
        bVar1 = std::
                regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30),
                           in_stack_fffffffffffffb28,
                           (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                           CONCAT17(in_stack_fffffffffffffb27,in_stack_fffffffffffffb20),
                           (match_flag_type)((ulong)in_stack_fffffffffffffb18 >> 0x20));
        if (bVar1) {
          std::__cxx11::
          match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::str((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 *)in_stack_fffffffffffffb18,(size_type)in_stack_fffffffffffffb10);
          local_2c8 = (_Optional_payload_base<metaf::Speed::Unit>)
                      Speed::unitFromString(in_stack_fffffffffffffb18);
          std::__cxx11::string::~string(local_2e8);
          bVar1 = std::optional<metaf::Speed::Unit>::has_value
                            ((optional<metaf::Speed::Unit> *)0x254259);
          if (bVar1) {
            std::__cxx11::
            match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::str((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)in_stack_fffffffffffffb18,(size_type)in_stack_fffffffffffffb10);
            std::optional<metaf::Speed::Unit>::operator*((optional<metaf::Speed::Unit> *)0x254314);
            local_2fc = (_Optional_payload_base<metaf::Speed>)
                        Speed::fromString((string *)
                                          CONCAT44(in_stack_fffffffffffffb44,
                                                   in_stack_fffffffffffffb40),
                                          (Unit)((ulong)in_stack_fffffffffffffb38 >> 0x20));
            std::__cxx11::string::~string(local_320);
            bVar1 = std::optional<metaf::Speed>::has_value((optional<metaf::Speed> *)0x254363);
            if (bVar1) {
              WindGroup(in_stack_fffffffffffffb10);
              local_3a9 = 0;
              local_3d1 = 0;
              dVar3 = std::__cxx11::
                      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ::length((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                *)in_stack_fffffffffffffb10,
                               CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
              in_stack_fffffffffffffb44 = in_stack_fffffffffffffb44 & 0xffffff;
              if (dVar3 == 0) {
                in_stack_fffffffffffffb38 =
                     std::__cxx11::
                     match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ::length((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               *)in_stack_fffffffffffffb10,
                              CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
                in_stack_fffffffffffffb44 = in_stack_fffffffffffffb44 & 0xffffff;
                if (in_stack_fffffffffffffb38 == 0) {
                  std::__cxx11::
                  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ::str((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)in_stack_fffffffffffffb18,(size_type)in_stack_fffffffffffffb10);
                  local_3a9 = 1;
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)in_stack_fffffffffffffb10,
                                          (char *)CONCAT44(in_stack_fffffffffffffb0c,
                                                           in_stack_fffffffffffffb08));
                  in_stack_fffffffffffffb44 = in_stack_fffffffffffffb44 & 0xffffff;
                  if (bVar1) {
                    std::__cxx11::
                    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ::str((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)in_stack_fffffffffffffb18,(size_type)in_stack_fffffffffffffb10);
                    local_3d1 = 1;
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)in_stack_fffffffffffffb10,
                                            (char *)CONCAT44(in_stack_fffffffffffffb0c,
                                                             in_stack_fffffffffffffb08));
                    in_stack_fffffffffffffb44 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffb44);
                  }
                }
              }
              unit = (Unit)((ulong)in_stack_fffffffffffffb38 >> 0x20);
              bVar6 = (byte)(in_stack_fffffffffffffb44 >> 0x18);
              if ((local_3d1 & 1) != 0) {
                std::__cxx11::string::~string(local_3d0);
              }
              if ((local_3a9 & 1) != 0) {
                std::__cxx11::string::~string(local_3a8);
              }
              if ((bVar6 & 1) == 0) {
                std::__cxx11::
                match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::str((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       *)in_stack_fffffffffffffb18,(size_type)in_stack_fffffffffffffb10);
                oVar4 = Direction::fromDegreesString
                                  ((string *)CONCAT17(bVar6,in_stack_fffffffffffffb30));
                local_410 = oVar4.super__Optional_base<metaf::Direction,_true,_true>._M_payload.
                            super__Optional_payload_base<metaf::Direction>._M_payload;
                local_408 = CONCAT31(local_408._1_3_,
                                     oVar4.super__Optional_base<metaf::Direction,_true,_true>.
                                     _M_payload.super__Optional_payload_base<metaf::Direction>.
                                     _M_engaged);
                local_3d8 = local_408;
                local_3e0 = local_410;
                std::__cxx11::string::~string(local_400);
                bVar1 = std::optional<metaf::Direction>::has_value
                                  ((optional<metaf::Direction> *)0x2545fb);
                if (bVar1) {
                  std::optional<metaf::Direction>::operator*((optional<metaf::Direction> *)0x254658)
                  ;
                  std::optional<metaf::Speed>::operator*((optional<metaf::Speed> *)0x254670);
                  std::__cxx11::
                  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ::str((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)in_stack_fffffffffffffb18,(size_type)in_stack_fffffffffffffb10);
                  std::optional<metaf::Speed::Unit>::operator*
                            ((optional<metaf::Speed::Unit> *)0x2546ae);
                  _Var5 = (_Optional_payload_base<metaf::Speed>)
                          Speed::fromString((string *)
                                            CONCAT44(in_stack_fffffffffffffb44,
                                                     in_stack_fffffffffffffb40),unit);
                  local_420 = _Var5;
                  std::__cxx11::string::~string(local_440);
                  bVar1 = std::optional<metaf::Speed>::has_value((optional<metaf::Speed> *)0x2546fd)
                  ;
                  if (bVar1) {
                    std::optional<metaf::Speed>::operator*((optional<metaf::Speed> *)0x254710);
                  }
                  std::__cxx11::
                  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ::str(_Var5._M_payload._0_8_,_Var5._8_8_);
                  Distance::fromHeightString
                            ((string *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40)
                            );
                  std::__cxx11::string::~string(local_478);
                  bVar1 = std::optional<metaf::Distance>::has_value
                                    ((optional<metaf::Distance> *)0x2547a5);
                  if (bVar1) {
                    std::optional<metaf::Distance>::operator*((optional<metaf::Distance> *)0x2547c3)
                    ;
                  }
                  std::optional<metaf::WindGroup>::optional<metaf::WindGroup,_true>
                            (_Var5._8_8_,
                             (WindGroup *)
                             CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
                  local_2ec = 1;
                }
                else {
                  memcpy(in_RDI,&parse::notRecognised,0x6c);
                  local_2ec = 1;
                }
              }
              else {
                std::optional<metaf::Speed>::operator*((optional<metaf::Speed> *)0x25450e);
                std::optional<metaf::WindGroup>::optional<metaf::WindGroup,_true>
                          ((optional<metaf::WindGroup> *)in_stack_fffffffffffffb10,
                           (WindGroup *)
                           CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
                local_2ec = 1;
              }
            }
            else {
              memcpy(in_RDI,&parse::notRecognised,0x6c);
              local_2ec = 1;
            }
          }
          else {
            memcpy(in_RDI,&parse::notRecognised,0x6c);
            local_2ec = 1;
          }
        }
        else {
          local_2ec = 0;
        }
        std::__cxx11::
        match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)0x254836);
        if (local_2ec == 0) {
          memcpy(in_RDI,&parse::notRecognised,0x6c);
        }
      }
    }
    else {
      memcpy(in_RDI,&parse::notRecognised,0x6c);
    }
  }
  return in_RDI;
}

Assistant:

std::optional<WindGroup> WindGroup::parse(const std::string & group,
		ReportPart reportPart,
		const ReportMetadata & reportMetadata)
{
	(void)reportMetadata;
	static const std::optional<WindGroup> notRecognised;

	if (reportPart == ReportPart::METAR) {
		if (group == "WS") return WindGroup(Type::WIND_SHEAR_IN_LOWER_LAYERS, IncompleteText::WS);
	}
	if (reportPart == ReportPart::TAF) {
		if (group == "WSCONDS") return WindGroup(Type::WSCONDS);
	}
	if (reportPart == ReportPart::RMK) {
		if (group == "WSHFT") return WindGroup(Type::WIND_SHIFT);
		if (group == "PK") return WindGroup(Type::PEAK_WIND, IncompleteText::PK);
		if (group == "WND") return WindGroup(Type::WND_MISG, IncompleteText::WND);
	}

	if (reportPart != ReportPart::METAR &&
		reportPart != ReportPart::TAF) return notRecognised;

	if (const auto result = parseVariableSector(group); result.has_value())
		return *result;

	static const std::regex windRgx("(?:WS(\\d\\d\\d)/)?"
		"(\\d\\d0|VRB|///)([1-9]?\\d\\d|//)(?:G([1-9]?\\d\\d))?([KM][TMP][HS]?)");
	static const auto matchWindShearHeight = 1, matchWindDir = 2;
	static const auto matchWindSpeed = 3, matchWindGust = 4, matchWindUnit = 5;

	// Surface wind or wind shear, e.g. dd0ssKT or dd0ssGggMPS or WShhhdd0ssGggKT
	if (std::smatch match; std::regex_match(group, match, windRgx)) {
		const auto speedUnit = Speed::unitFromString(match.str(matchWindUnit));
		if (!speedUnit.has_value()) return notRecognised;
		const auto speed = Speed::fromString(match.str(matchWindSpeed), *speedUnit);
		if (!speed.has_value()) return notRecognised;

		WindGroup result;

		if (!match.length(matchWindShearHeight) && 
			!match.length(matchWindGust) &&
			match.str(matchWindDir) == "000" &&
			match.str(matchWindSpeed) == "00")
		{
			//00000KT or 00000MPS or 00000KMH: calm wind
			result.windType = Type::SURFACE_WIND_CALM;
			result.wSpeed = *speed;
			return result;
		}

		const auto dir = Direction::fromDegreesString(match.str(matchWindDir));
		if (!dir.has_value()) return notRecognised;
		result.windDir = *dir;
		result.wSpeed = *speed;
		const auto gust = Speed::fromString(match.str(matchWindGust), *speedUnit);
		if (gust.has_value()) result.gSpeed = *gust;
		const auto wsHeight = Distance::fromHeightString(match.str(matchWindShearHeight));
		result.windType = Type::SURFACE_WIND;
		if (wsHeight.has_value()) {
			result.windType = Type::WIND_SHEAR;
			result.wShHeight = *wsHeight;
		}
		return result;
	}

	return notRecognised;
}